

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenio::save_nodes(tetgenio *this,char *filebasename)

{
  double *pdVar1;
  FILE *pFVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  char outmtrfilename [1024];
  char outnodefilename [1024];
  
  sprintf(outnodefilename,"%s.node");
  printf("Saving nodes to %s\n",outnodefilename);
  pFVar2 = fopen(outnodefilename,"w");
  fprintf(pFVar2,"%d  %d  %d  %d\n",(ulong)(uint)this->numberofpoints,(ulong)(uint)this->mesh_dim,
          (ulong)(uint)this->numberofpointattributes,(ulong)(this->pointmarkerlist != (int *)0x0));
  for (lVar4 = 0; lVar4 < this->numberofpoints; lVar4 = lVar4 + 1) {
    uVar3 = (ulong)(uint)(this->firstnumber + (int)lVar4);
    pdVar1 = this->pointlist;
    if (this->mesh_dim == 2) {
      fprintf(pFVar2,"%d  %.16g  %.16g",pdVar1[lVar4 * 3],pdVar1[lVar4 * 3 + 1],uVar3);
    }
    else {
      fprintf(pFVar2,"%d  %.16g  %.16g  %.16g",pdVar1[lVar4 * 3],pdVar1[lVar4 * 3 + 1],
              pdVar1[lVar4 * 3 + 2],uVar3);
    }
    for (iVar6 = 0; iVar6 < this->numberofpointattributes; iVar6 = iVar6 + 1) {
      fprintf(pFVar2,"  %.16g",
              this->pointattributelist[this->numberofpointattributes * (int)lVar4 + iVar6]);
    }
    if (this->pointmarkerlist != (int *)0x0) {
      fprintf(pFVar2,"  %d",(ulong)(uint)this->pointmarkerlist[lVar4]);
    }
    fputc(10,pFVar2);
  }
  fclose(pFVar2);
  if ((0 < this->numberofpointmtrs) && (this->pointmtrlist != (double *)0x0)) {
    sprintf(outmtrfilename,"%s.mtr",filebasename);
    printf("Saving metrics to %s\n",outmtrfilename);
    pFVar2 = fopen(outmtrfilename,"w");
    fprintf(pFVar2,"%d  %d\n",(ulong)(uint)this->numberofpoints,(ulong)(uint)this->numberofpointmtrs
           );
    for (iVar6 = 0; iVar6 < this->numberofpoints; iVar6 = iVar6 + 1) {
      for (iVar5 = 0; iVar5 < this->numberofpointmtrs; iVar5 = iVar5 + 1) {
        fprintf(pFVar2,"%.16g ",this->pointmtrlist[this->numberofpointmtrs * iVar6 + iVar5]);
      }
      fputc(10,pFVar2);
    }
    fclose(pFVar2);
  }
  return;
}

Assistant:

void tetgenio::save_nodes(char* filebasename)
{
  FILE *fout;
  char outnodefilename[FILENAMESIZE];
  char outmtrfilename[FILENAMESIZE];
  int i, j;

  sprintf(outnodefilename, "%s.node", filebasename);
  printf("Saving nodes to %s\n", outnodefilename);
  fout = fopen(outnodefilename, "w");
  fprintf(fout, "%d  %d  %d  %d\n", numberofpoints, mesh_dim,
          numberofpointattributes, pointmarkerlist != NULL ? 1 : 0);
  for (i = 0; i < numberofpoints; i++) {
    if (mesh_dim == 2) {
      fprintf(fout, "%d  %.16g  %.16g", i + firstnumber, pointlist[i * 3],
              pointlist[i * 3 + 1]);
    } else {
      fprintf(fout, "%d  %.16g  %.16g  %.16g", i + firstnumber,
              pointlist[i * 3], pointlist[i * 3 + 1], pointlist[i * 3 + 2]);
    }
    for (j = 0; j < numberofpointattributes; j++) {
      fprintf(fout, "  %.16g", 
              pointattributelist[i * numberofpointattributes + j]);
    }
    if (pointmarkerlist != NULL) {
      fprintf(fout, "  %d", pointmarkerlist[i]);
    }
    fprintf(fout, "\n");
  }
  fclose(fout);

  // If the point metrics exist, output them to a .mtr file.
  if ((numberofpointmtrs > 0) && (pointmtrlist != (REAL *) NULL)) {
    sprintf(outmtrfilename, "%s.mtr", filebasename);
    printf("Saving metrics to %s\n", outmtrfilename);
    fout = fopen(outmtrfilename, "w");
    fprintf(fout, "%d  %d\n", numberofpoints, numberofpointmtrs);
    for (i = 0; i < numberofpoints; i++) {
      for (j = 0; j < numberofpointmtrs; j++) {
        fprintf(fout, "%.16g ", pointmtrlist[i * numberofpointmtrs + j]);
      }
      fprintf(fout, "\n");
    }
    fclose(fout);
  }
}